

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Constraint.cpp
# Opt level: O2

RealType __thiscall
QuantLib::Constraint::update
          (Constraint *this,DynamicVector<double,_std::allocator<double>_> *params,
          DynamicVector<double,_std::allocator<double>_> *direction,RealType beta)

{
  uint uVar1;
  uint uVar2;
  DynamicVector<double,_std::allocator<double>_> newParams;
  double local_88;
  _Vector_base<double,_std::allocator<double>_> local_78;
  _Vector_base<double,_std::allocator<double>_> local_60;
  _Vector_base<double,_std::allocator<double>_> local_48;
  
  OpenMD::operator*((DynamicVector<double,_std::allocator<double>_> *)&local_78,beta,direction);
  OpenMD::operator+((DynamicVector<double,_std::allocator<double>_> *)&local_60,params,
                    (DynamicVector<double,_std::allocator<double>_> *)&local_78);
  std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base(&local_78);
  uVar1 = (*this->impl_->_vptr_Impl[2])(this->impl_,&local_60);
  uVar2 = 0;
  local_88 = beta;
  while ((uVar1 & 1) == 0) {
    if (200 < uVar2) {
      builtin_strncpy(painCave.errMsg,"can\'t update parameter vector\n",0x1f);
      painCave.isFatal = 1;
      painCave.severity = 1;
      simError();
    }
    local_88 = local_88 * 0.5;
    OpenMD::operator*((DynamicVector<double,_std::allocator<double>_> *)&local_48,local_88,direction
                     );
    OpenMD::operator+((DynamicVector<double,_std::allocator<double>_> *)&local_78,params,
                      (DynamicVector<double,_std::allocator<double>_> *)&local_48);
    std::vector<double,_std::allocator<double>_>::_M_move_assign
              ((vector<double,_std::allocator<double>_> *)&local_60,&local_78);
    std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base(&local_78);
    std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base(&local_48);
    uVar2 = uVar2 + 1;
    uVar1 = (*this->impl_->_vptr_Impl[2])(this->impl_,&local_60);
  }
  OpenMD::operator*((DynamicVector<double,_std::allocator<double>_> *)&local_78,local_88,direction);
  OpenMD::DynamicVector<double,_std::allocator<double>_>::add
            (params,(DynamicVector<double,_std::allocator<double>_> *)&local_78);
  std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base(&local_78);
  std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base(&local_60);
  return local_88;
}

Assistant:

RealType Constraint::update(DynamicVector<RealType>& params,
                              const DynamicVector<RealType>& direction,
                              RealType beta) {
    RealType diff                     = beta;
    DynamicVector<RealType> newParams = params + diff * direction;
    bool valid                        = test(newParams);
    int icount                        = 0;
    while (!valid) {
      if (icount > 200) {
        snprintf(painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
                 "can't update parameter vector\n");
        painCave.isFatal  = 1;
        painCave.severity = OPENMD_ERROR;
        simError();
      }
      diff *= 0.5;
      icount++;
      newParams = params + diff * direction;
      valid     = test(newParams);
    }
    params += diff * direction;
    return diff;
  }